

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *io;
  TValue *slot;
  TValue k;
  StkId o;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  k._8_8_ = index2addr(L,idx);
  k.value_.b = 2;
  slot = (TValue *)p;
  pTVar3 = luaH_set(L,(Table *)(((TValue *)k._8_8_)->value_).gc,(TValue *)&slot);
  pTVar1 = L->top;
  pTVar3->value_ = pTVar1[-1].value_;
  uVar2 = *(undefined4 *)&pTVar1[-1].field_0xc;
  pTVar3->tt_ = pTVar1[-1].tt_;
  *(undefined4 *)&pTVar3->field_0xc = uVar2;
  if ((((L->top[-1].tt_ & 0x40U) != 0) && ((*(byte *)(*(long *)k._8_8_ + 9) & 4) != 0)) &&
     (((L->top[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,*(Table **)k._8_8_);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp(lua_State *L, int idx, const void *p) {
    StkId o;
    TValue k, *slot;
    lua_lock(L);
    api_checknelems(L, 1);
    o = index2addr(L, idx);
    api_check(L, ttistable(o), "table expected");
    setpvalue(&k, cast(
            void *, p));
    slot = luaH_set(L, hvalue(o), &k);
    setobj2t(L, slot, L->top - 1);
    luaC_barrierback(L, hvalue(o), L->top - 1);
    L->top--;
    lua_unlock(L);
}